

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_ref.c
# Opt level: O0

apx_portConnectorChangeRef_t *
apx_portConnectorChangeRef_new
          (apx_nodeInstance_t *nodeInstance,apx_portConnectorChangeTable_t *connector_changes)

{
  apx_portConnectorChangeRef_t *self_00;
  apx_portConnectorChangeRef_t *self;
  apx_portConnectorChangeTable_t *connector_changes_local;
  apx_nodeInstance_t *nodeInstance_local;
  
  self_00 = (apx_portConnectorChangeRef_t *)malloc(0x18);
  if (self_00 != (apx_portConnectorChangeRef_t *)0x0) {
    apx_portConnectorChangeRef_create(self_00,nodeInstance,connector_changes);
  }
  return self_00;
}

Assistant:

apx_portConnectorChangeRef_t *apx_portConnectorChangeRef_new(apx_nodeInstance_t *nodeInstance, apx_portConnectorChangeTable_t *connector_changes)
{
   apx_portConnectorChangeRef_t *self = (apx_portConnectorChangeRef_t*) malloc(sizeof(apx_portConnectorChangeRef_t));
   if (self != NULL)
   {
      apx_portConnectorChangeRef_create(self, nodeInstance, connector_changes);
   }
   return self;
}